

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::GBtailVisitor::GBtailVisitor(GBtailVisitor *this,SimInfo *info)

{
  allocator<char> local_49;
  string local_48;
  Vector<double,_3U> local_28;
  
  ReplacementVisitor::ReplacementVisitor(&this->super_ReplacementVisitor,info);
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_00283258;
  std::__cxx11::string::assign
            ((char *)&(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                      visitorName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GBtail",(allocator<char> *)&local_28);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"C",&local_49);
  Vector<double,_3U>::Vector(&local_28);
  local_28.data_[0] = 0.0;
  local_28.data_[1] = 0.0;
  local_28.data_[2] = 9.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_48,(Vector3d *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"C",&local_49);
  Vector<double,_3U>::Vector(&local_28);
  local_28.data_[0] = 0.0;
  local_28.data_[1] = 0.0;
  local_28.data_[2] = 0.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_48,(Vector3d *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"C",&local_49);
  Vector<double,_3U>::Vector(&local_28);
  local_28.data_[0] = 0.0;
  local_28.data_[1] = 0.0;
  local_28.data_[2] = -9.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_48,(Vector3d *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

GBtailVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBtailVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBtail");

      // this is the reference structure we'll use for the replacement:
      addSite("C", Vector3d(0.0, 0.0, 9.0));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("C", Vector3d(0.0, 0.0, -9.0));
    }